

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Double(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,double d)

{
  double *pdVar1;
  
  pdVar1 = (double *)(this->stack_).stackTop_;
  if ((long)(this->stack_).stackEnd_ - (long)pdVar1 < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
    pdVar1 = (double *)(this->stack_).stackTop_;
  }
  (this->stack_).stackTop_ = (char *)(pdVar1 + 2);
  pdVar1[1] = 1.3140351748525322e-298;
  *pdVar1 = d;
  return true;
}

Assistant:

bool Double(double d) { new (stack_.template Push<ValueType>()) ValueType(d); return true; }